

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::Serializer(Serializer *this)

{
  allocator<unsigned_char> local_11;
  Serializer *local_10;
  Serializer *this_local;
  
  this->_vptr_Serializer = (_func_int **)&PTR__Serializer_003eb758;
  local_10 = this;
  ::std::allocator<unsigned_char>::allocator(&local_11);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_,8,&local_11);
  ::std::allocator<unsigned_char>::~allocator(&local_11);
  this->offset_ = 0;
  return;
}

Assistant:

Serializer::Serializer() : buffer_(8), offset_(0) {
  // do nothing
}